

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortedSingleFileIndexedStorage.hpp
# Opt level: O2

void __thiscall
supermap::
SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>
::SortedSingleFileIndexedStorage
          (SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>
           *this,vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>_>_>
                 *newer,string *dataFileName,shared_ptr<supermap::io::FileManager> *fileManager,
          uint batchSize,InnerRegisterSupplier *registerSupplier)

{
  _Manager_type p_Var1;
  pointer pSVar2;
  SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>
  *pSVar3;
  size_t sVar4;
  pointer poVar5;
  size_t sVar6;
  int iVar7;
  uint uVar8;
  size_type __n;
  undefined8 uVar9;
  KeyValue<supermap::Key<1UL>,_unsigned_int> *pKVar10;
  KeyValue<supermap::Key<1UL>,_unsigned_int> *pKVar11;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  uint *extraout_RAX;
  uint *puVar12;
  uint *extraout_RAX_00;
  long lVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  bool bVar18;
  uint batchSize_local;
  SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>
  *local_118;
  bool hasMin;
  size_t min;
  vector<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>_>
  frontLine;
  vector<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>
  writeBuffer;
  _Any_data local_c8;
  _Manager_type local_b8;
  _Invoker_type local_b0;
  ulong local_a8;
  KeyValue<supermap::Key<1UL>,_unsigned_int> minItem;
  anon_class_24_3_7a9e0d2b updateOnce;
  vector<unsigned_int,_std::allocator<unsigned_int>_> currentFrontPointers;
  shared_ptr<supermap::io::FileManager> local_58;
  anon_class_24_3_5b0b3c05 dropWriteBuffer;
  
  batchSize_local = batchSize;
  std::filesystem::__cxx11::path::path((path *)&currentFrontPointers,dataFileName,auto_format);
  local_58.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (fileManager->super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr;
  local_58.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (fileManager->super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>).
          _M_refcount._M_pi;
  (fileManager->super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>).
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (fileManager->super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  local_c8._M_unused._M_object = (void *)0x0;
  local_c8._8_8_ = 0;
  local_b8 = (_Manager_type)0x0;
  local_b0 = registerSupplier->_M_invoker;
  p_Var1 = (registerSupplier->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_c8._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(registerSupplier->super__Function_base)._M_functor;
    local_c8._8_8_ = *(undefined8 *)((long)&(registerSupplier->super__Function_base)._M_functor + 8)
    ;
    (registerSupplier->super__Function_base)._M_manager = (_Manager_type)0x0;
    registerSupplier->_M_invoker = (_Invoker_type)0x0;
    local_b8 = p_Var1;
  }
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
  ::SingleFileIndexedStorage
            (&this->
              super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
             ,(path *)&currentFrontPointers,&local_58,(InnerRegisterSupplier *)&local_c8);
  std::_Function_base::~_Function_base((_Function_base *)&local_c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::filesystem::__cxx11::path::~path((path *)&currentFrontPointers);
  (this->
  super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
  ).super_IndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>.
  super_OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>.
  _vptr_OrderedStorage = (_func_int **)&PTR_append_001f4520;
  (this->super_Findable<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_supermap::Key<1UL>_>).
  _vptr_Findable = (_func_int **)&DAT_001f4568;
  __n = ((long)(newer->
               super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish -
        (long)(newer->
              super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start) / 0x38;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&currentFrontPointers,__n,(allocator_type *)&frontLine);
  updateOnce.newer =
       (vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>_>_>
        *)((ulong)updateOnce.newer & 0xffffffffffffff00);
  local_118 = this;
  std::
  vector<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>_>
  ::vector(&frontLine,__n,(value_type *)&updateOnce,(allocator_type *)&writeBuffer);
  lVar14 = 8;
  lVar17 = 0;
  lVar13 = 0;
  _hasMin = (uint *)__n;
  while (pSVar3 = local_118, bVar18 = __n != 0, __n = __n - 1, bVar18) {
    pSVar2 = (newer->
             super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    iVar7 = (**(code **)(*(long *)((long)&(pSVar2->
                                          super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
                                          ).
                                          super_IndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
                                          .
                                          super_OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
                                          ._vptr_OrderedStorage + lVar17) + 8))
                      ((long)&(pSVar2->
                              super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
                              ).
                              super_IndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
                              .
                              super_OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
                              ._vptr_OrderedStorage + lVar17);
    poVar5 = frontLine.
             super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (iVar7 != 0) {
      pSVar2 = (newer->
               super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar9 = (**(code **)(*(long *)((long)&(pSVar2->
                                            super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
                                            ).
                                            super_IndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
                                            .
                                            super_OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
                                            ._vptr_OrderedStorage + lVar17) + 0x20))
                        ((long)&(pSVar2->
                                super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
                                ).
                                super_IndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
                                .
                                super_OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
                                ._vptr_OrderedStorage + lVar17,0);
      if (*(char *)((long)&(poVar5->
                           super__Optional_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_true,_true>
                           )._M_payload.
                           super__Optional_payload_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>
                           ._M_payload + lVar14) == '\x01') {
        *(undefined1 *)
         ((long)&(poVar5->
                 super__Optional_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_true,_true>
                 )._M_payload.
                 super__Optional_payload_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>
                 ._M_payload + lVar14) = 0;
      }
      *(undefined8 *)((long)poVar5 + lVar14 + -8) = uVar9;
      *(undefined1 *)
       ((long)&(poVar5->
               super__Optional_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_true,_true>
               )._M_payload.
               super__Optional_payload_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>.
               _M_payload + lVar14) = 1;
      pSVar2 = (newer->
               super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar8 = (**(code **)(*(long *)((long)&(pSVar2->
                                            super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
                                            ).
                                            super_IndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
                                            .
                                            super_OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
                                            ._vptr_OrderedStorage + lVar17) + 8))
                        ((long)&(pSVar2->
                                super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
                                ).
                                super_IndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
                                .
                                super_OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
                                ._vptr_OrderedStorage + lVar17);
      lVar13 = lVar13 + (ulong)uVar8;
    }
    lVar17 = lVar17 + 0x38;
    lVar14 = lVar14 + 0xc;
  }
  (*(local_118->
    super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
    ).super_IndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
    .super_OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>.
    register_.
    super_StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_supermap::CountingStorageInfo<unsigned_int,_void>_>
    .
    super_Cloneable<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_supermap::CountingStorageInfo<unsigned_int,_void>_>_>
    ._vptr_Cloneable[5])
            (&(local_118->
              super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
              ).
              super_IndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
              .
              super_OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void>
              .register_,lVar13);
  updateOnce.currentFrontPointers = &currentFrontPointers;
  updateOnce.frontLine = &frontLine;
  writeBuffer.
  super__Vector_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  writeBuffer.
  super__Vector_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  writeBuffer.
  super__Vector_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  updateOnce.newer = newer;
  std::
  vector<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>
  ::reserve(&writeBuffer,(ulong)batchSize_local);
  dropWriteBuffer.this = pSVar3;
  puVar12 = &batchSize_local;
  local_a8 = (ulong)_hasMin & 0xffffffff;
  dropWriteBuffer.writeBuffer = &writeBuffer;
  dropWriteBuffer.batchSize = puVar12;
  while( true ) {
    min = 0;
    _hasMin = (uint *)0x0;
    for (uVar16 = local_a8; sVar6 = min, uVar8 = (int)uVar16 - 1, -1 < (int)uVar8;
        uVar16 = uVar16 - 1) {
      uVar15 = (ulong)uVar8;
      if (frontLine.
          super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar15].
          super__Optional_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_true,_true>.
          _M_payload.
          super__Optional_payload_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>.
          _M_engaged == true) {
        sVar6 = uVar15;
        if (((ulong)_hasMin & 1) == 0) {
          puVar12 = (uint *)CONCAT71((int7)((ulong)puVar12 >> 8),1);
          _hasMin = puVar12;
        }
        else {
          pKVar10 = std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>::value
                              (frontLine.
                               super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + uVar15);
          sVar4 = min;
          pKVar11 = std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>::value
                              (frontLine.
                               super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + min);
          bVar18 = std::operator<((array<unsigned_char,_1UL> *)pKVar10,
                                  (array<unsigned_char,_1UL> *)pKVar11);
          puVar12 = (uint *)CONCAT71(extraout_var,bVar18);
          if (!bVar18) {
            pKVar10 = std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>::value
                                (frontLine.
                                 super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + uVar15);
            pKVar11 = std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>::value
                                (frontLine.
                                 super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + sVar4);
            bVar18 = std::operator==((array<unsigned_char,_1UL> *)pKVar10,
                                     (array<unsigned_char,_1UL> *)pKVar11);
            puVar12 = (uint *)CONCAT71(extraout_var_00,bVar18);
            sVar6 = min;
            if (bVar18) {
              SortedSingleFileIndexedStorage::anon_class_24_3_7a9e0d2b::operator()
                        (&updateOnce,uVar8);
              puVar12 = extraout_RAX;
              sVar6 = min;
            }
          }
        }
      }
      min = sVar6;
    }
    if (((ulong)_hasMin & 1) == 0) break;
    pKVar10 = std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>::value
                        (frontLine.
                         super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + min);
    minItem = *pKVar10;
    SortedSingleFileIndexedStorage::anon_class_24_3_7a9e0d2b::operator()(&updateOnce,(int32_t)sVar6)
    ;
    std::
    vector<supermap::KeyValue<supermap::Key<1ul>,unsigned_int>,std::allocator<supermap::KeyValue<supermap::Key<1ul>,unsigned_int>>>
    ::emplace_back<supermap::KeyValue<supermap::Key<1ul>,unsigned_int>>
              ((vector<supermap::KeyValue<supermap::Key<1ul>,unsigned_int>,std::allocator<supermap::KeyValue<supermap::Key<1ul>,unsigned_int>>>
                *)&writeBuffer,&minItem);
    puVar12 = (uint *)((ulong)((long)writeBuffer.
                                     super__Vector_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)writeBuffer.
                                    super__Vector_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3);
    if (batchSize_local <= (uint)puVar12) {
      SortedSingleFileIndexedStorage::anon_class_24_3_5b0b3c05::operator()(&dropWriteBuffer);
      puVar12 = extraout_RAX_00;
    }
  }
  SortedSingleFileIndexedStorage::anon_class_24_3_5b0b3c05::operator()(&dropWriteBuffer);
  std::
  _Vector_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>
  ::~_Vector_base(&writeBuffer.
                   super__Vector_base<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>
                 );
  std::
  _Vector_base<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>_>
  ::~_Vector_base(&frontLine.
                   super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>_>_>_>
                 );
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&currentFrontPointers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return;
}

Assistant:

explicit SortedSingleFileIndexedStorage(
        const std::vector<SortedSingleFileIndexedStorage<T, IndexT, RegisterInfo, FindPattern>> &newer,
        std::string dataFileName,
        std::shared_ptr<io::FileManager> fileManager,
        IndexT batchSize,
        InnerRegisterSupplier registerSupplier
    ) : SingleFileIndexedStorage<T, IndexT, RegisterInfo>(
        std::move(dataFileName),
        std::move(fileManager),
        std::move(registerSupplier)
    ) {
        const std::size_t storagesCount = newer.size();
        std::vector<IndexT> currentFrontPointers(storagesCount);
        std::vector<std::optional<T>> frontLine(storagesCount, std::nullopt);
        std::uint64_t totalSize = 0;
        for (std::size_t i = 0; i < storagesCount; ++i) {
            if (newer[i].getItemsCount() > 0) {
                frontLine[i].emplace(newer[i].get(0));
                totalSize += newer[i].getItemsCount();
            }
        }
        getRegister().reserve(totalSize);
        auto updateOnce = [&](std::int32_t i) {
            if (++currentFrontPointers[i] < newer[i].getItemsCount()) {
                frontLine[i].emplace(newer[i].get(currentFrontPointers[i]));
            } else {
                frontLine[i].reset();
            }
        };

        std::vector<T> writeBuffer;
        writeBuffer.reserve(batchSize);

        auto dropWriteBuffer = [&]() {
            appendAll(writeBuffer.begin(), writeBuffer.end());
            writeBuffer.clear();
            writeBuffer.reserve(batchSize);
        };

        while (true) {
            std::size_t min = 0;
            bool hasMin = false;
            for (std::int32_t i = storagesCount - 1; i >= 0; --i) {
                if (!frontLine[i].has_value()) {
                    continue;
                }
                if (!hasMin) {
                    hasMin = true;
                    min = i;
                    continue;
                }
                if (frontLine[i].value() < frontLine[min].value()) {
                    min = i;
                } else if (frontLine[i].value() == frontLine[min].value()) {
                    updateOnce(i);
                }
            }
            if (!hasMin) {
                break;
            }
            T minItem = frontLine[min].value();
            updateOnce(min);
            writeBuffer.push_back(std::move(minItem));
            if (static_cast<IndexT>(writeBuffer.size()) >= batchSize) {
                dropWriteBuffer();
            }
        }
        dropWriteBuffer();
    }